

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

SimpleString BracketsFormattedHexStringFrom(int value)

{
  size_t extraout_RDX;
  undefined4 in_register_0000003c;
  SimpleString *hexString;
  SimpleString SVar1;
  SimpleString local_28;
  SimpleString *pSStack_10;
  int value_local;
  
  hexString = (SimpleString *)CONCAT44(in_register_0000003c,value);
  pSStack_10 = hexString;
  HexStringFrom((int)&local_28);
  BracketsFormattedHexString(hexString);
  SimpleString::~SimpleString(&local_28);
  SVar1.bufferSize_ = extraout_RDX;
  SVar1.buffer_ = (char *)hexString;
  return SVar1;
}

Assistant:

SimpleString BracketsFormattedHexStringFrom(int value)
{
    return BracketsFormattedHexString(HexStringFrom(value));
}